

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QString * __thiscall
QHash<ReplaceExtraCompilerCacheKey,_QString>::value
          (QString *__return_storage_ptr__,QHash<ReplaceExtraCompilerCacheKey,_QString> *this,
          ReplaceExtraCompilerCacheKey *key)

{
  Data *pDVar1;
  Node<ReplaceExtraCompilerCacheKey,_QString> *pNVar2;
  QString *pQVar3;
  
  if (this->d != (Data<QHashPrivate::Node<ReplaceExtraCompilerCacheKey,_QString>_> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<ReplaceExtraCompilerCacheKey,_QString>_>::
             findNode<ReplaceExtraCompilerCacheKey>(this->d,key);
    if (pNVar2 != (Node<ReplaceExtraCompilerCacheKey,_QString> *)0x0) {
      pQVar3 = &pNVar2->value;
      goto LAB_001707cf;
    }
  }
  pQVar3 = (QString *)0x0;
LAB_001707cf:
  if (pQVar3 == (QString *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar1 = (pQVar3->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (pQVar3->d).ptr;
    (__return_storage_ptr__->d).size = (pQVar3->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }